

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::_lookup_path_or_create(Tree *this,csubstr path,size_t start)

{
  error_flags eVar1;
  size_t in_RCX;
  lookup_result *in_RDX;
  char *in_RSI;
  bool bVar2;
  csubstr cVar3;
  lookup_result r;
  lookup_result *in_stack_ffffffffffffff60;
  char *local_78;
  size_t local_70;
  size_t local_58;
  Tree *in_stack_ffffffffffffffb0;
  size_t local_30;
  Tree *in_stack_fffffffffffffff0;
  
  local_30 = in_RCX;
  if (in_RCX == 0xffffffffffffffff) {
    local_30 = root_id(in_stack_ffffffffffffffb0);
  }
  cVar3.len = (size_t)in_RDX;
  cVar3.str = in_RSI;
  lookup_result::lookup_result((lookup_result *)&local_58,cVar3,local_30);
  _lookup_path(in_stack_fffffffffffffff0,in_RDX);
  if (local_58 == 0xffffffffffffffff) {
    _lookup_path_modify(in_stack_fffffffffffffff0,in_RDX);
  }
  else {
    cVar3 = lookup_result::unresolved(in_stack_ffffffffffffff60);
    local_70 = cVar3.len;
    bVar2 = true;
    if (local_70 != 0) {
      local_78 = cVar3.str;
      bVar2 = local_78 == (char *)0x0;
    }
    if (!bVar2) {
      eVar1 = get_error_flags();
      if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x34984b,(char *)0x68de,"check failed: %s","r.unresolved().empty()");
    }
  }
  return local_58;
}

Assistant:

size_t Tree::_lookup_path_or_create(csubstr path, size_t start)
{
    if(start == NONE)
        start = root_id();
    lookup_result r(path, start);
    _lookup_path(&r);
    if(r.target != NONE)
    {
        C4_ASSERT(r.unresolved().empty());
        return r.target;
    }
    _lookup_path_modify(&r);
    return r.target;
}